

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::GreenRoomThree(ItemTable *this)

{
  ItemWrapper *this_00;
  mapped_type *ppIVar1;
  key_type local_7c;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  Item local_40;
  ItemWrapper *local_18;
  ItemWrapper *Basin;
  ItemTable *this_local;
  
  Basin = (ItemWrapper *)this;
  this_00 = (ItemWrapper *)operator_new(0x58);
  local_75 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Basin",&local_61);
  Item::Item(&local_40,(string *)local_60,BASIN);
  ItemWrapper::ItemWrapper(this_00,&local_40,G_ROOM3_BASIN);
  local_75 = 0;
  Item::~Item(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_7c = BASIN;
  local_18 = this_00;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_7c);
  *ppIVar1 = this_00;
  return;
}

Assistant:

void ItemTable::GreenRoomThree() {
    ItemWrapper * Basin = new ItemWrapper(Item("Basin", BASIN), G_ROOM3_BASIN);

    items[BASIN] = Basin;
}